

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O3

int32_t __thiscall icu_63::UnicodeSet::indexOf(UnicodeSet *this,UChar32 c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int32_t iVar5;
  int iVar6;
  
  iVar5 = -1;
  if ((uint)c < 0x110000) {
    piVar4 = this->list + 1;
    iVar3 = 0;
    do {
      iVar6 = iVar3;
      iVar1 = piVar4[-1];
      if (c < iVar1) {
        return -1;
      }
      iVar2 = *piVar4;
      piVar4 = piVar4 + 2;
      iVar3 = (iVar6 - iVar1) + iVar2;
    } while (iVar2 <= c);
    iVar5 = (iVar6 + c) - iVar1;
  }
  return iVar5;
}

Assistant:

int32_t UnicodeSet::indexOf(UChar32 c) const {
    if (c < MIN_VALUE || c > MAX_VALUE) {
        return -1;
    }
    int32_t i = 0;
    int32_t n = 0;
    for (;;) {
        UChar32 start = list[i++];
        if (c < start) {
            return -1;
        }
        UChar32 limit = list[i++];
        if (c < limit) {
            return n + c - start;
        }
        n += limit - start;
    }
}